

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void absFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMVar1;
  i64 val;
  double dVar2;
  double val_00;
  
  pMVar1 = *argv;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
      [pMVar1->flags & 0x1f] == '\x05') {
    pMVar1 = context->pOut;
    if ((pMVar1->flags & 0x2460) != 0) {
      vdbeMemClearExternAndSetNull(pMVar1);
      return;
    }
    pMVar1->flags = 1;
  }
  else {
    if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
        [pMVar1->flags & 0x1f] != '\x01') {
      dVar2 = sqlite3VdbeRealValue(pMVar1);
      val_00 = -dVar2;
      if (-dVar2 <= dVar2) {
        val_00 = dVar2;
      }
      sqlite3VdbeMemSetDouble(context->pOut,val_00);
      return;
    }
    val = sqlite3VdbeIntValue(pMVar1);
    if (val < 0) {
      val = -val;
    }
    pMVar1 = context->pOut;
    if ((pMVar1->flags & 0x2460) != 0) {
      vdbeReleaseAndSetInt64(pMVar1,val);
      return;
    }
    (pMVar1->u).i = val;
    pMVar1->flags = 4;
  }
  return;
}

Assistant:

static void absFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_INTEGER: {
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal<0 ){
        if( iVal==SMALLEST_INT64 ){
          /* IMP: R-31676-45509 If X is the integer -9223372036854775808
          ** then abs(X) throws an integer overflow error since there is no
          ** equivalent positive 64-bit two complement value. */
          sqlite3_result_error(context, "integer overflow", -1);
          return;
        }
        iVal = -iVal;
      } 
      sqlite3_result_int64(context, iVal);
      break;
    }
    case SQLITE_NULL: {
      /* IMP: R-37434-19929 Abs(X) returns NULL if X is NULL. */
      sqlite3_result_null(context);
      break;
    }
    default: {
      /* Because sqlite3_value_double() returns 0.0 if the argument is not
      ** something that can be converted into a number, we have:
      ** IMP: R-01992-00519 Abs(X) returns 0.0 if X is a string or blob
      ** that cannot be converted to a numeric value.
      */
      double rVal = sqlite3_value_double(argv[0]);
      if( rVal<0 ) rVal = -rVal;
      sqlite3_result_double(context, rVal);
      break;
    }
  }
}